

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccopy_to_ucol.c
# Opt level: O0

int ccopy_to_ucol(int jcol,int nseg,int *segrep,int *repfnz,int *perm_r,singlecomplex *dense,
                 GlobalLU_t *Glu)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int_t *piVar6;
  int iVar7;
  int_t iVar8;
  singlecomplex local_b4;
  singlecomplex zero;
  int_t nzumax;
  int_t *xusub;
  int_t *usub;
  singlecomplex *ucol;
  int_t *xlsub;
  int_t *lsub;
  int *supno;
  int *xsup;
  int_t mem_error;
  int_t new_next;
  int_t nextu;
  int_t isub;
  int jsupno;
  int irow;
  int fsupc;
  int segsze;
  int kfnz;
  int k;
  int i;
  int ksupno;
  int krep;
  int ksub;
  singlecomplex *dense_local;
  int *perm_r_local;
  int *repfnz_local;
  int *segrep_local;
  int nseg_local;
  int jcol_local;
  
  memset(&local_b4,0,8);
  piVar4 = Glu->xsup;
  piVar5 = Glu->supno;
  xlsub = Glu->lsub;
  piVar6 = Glu->xlsub;
  usub = (int_t *)Glu->ucol;
  xusub = Glu->usub;
  unique0x00012000 = Glu->xusub;
  zero.r = (float)Glu->nzumax;
  iVar1 = piVar5[jcol];
  mem_error = unique0x00012000[jcol];
  ksupno = 0;
  segsze = nseg + -1;
  do {
    if (nseg <= ksupno) {
      stack0xffffffffffffff58[jcol + 1] = mem_error;
      return 0;
    }
    iVar7 = segrep[segsze];
    iVar2 = piVar5[iVar7];
    if ((iVar2 != iVar1) && (iVar3 = repfnz[iVar7], iVar3 != -1)) {
      new_next = (piVar6[piVar4[iVar2]] + iVar3) - piVar4[iVar2];
      iVar7 = (iVar7 - iVar3) + 1;
      while ((int)zero.r < mem_error + iVar7) {
        iVar8 = cLUMemXpand(jcol,mem_error,UCOL,(int_t *)&zero,Glu);
        if (iVar8 != 0) {
          return iVar8;
        }
        usub = (int_t *)Glu->ucol;
        iVar8 = cLUMemXpand(jcol,mem_error,USUB,(int_t *)&zero,Glu);
        if (iVar8 != 0) {
          return iVar8;
        }
        xusub = Glu->usub;
        xlsub = Glu->lsub;
      }
      for (kfnz = 0; kfnz < iVar7; kfnz = kfnz + 1) {
        iVar2 = xlsub[new_next];
        xusub[mem_error] = perm_r[iVar2];
        *(singlecomplex *)(usub + (long)mem_error * 2) = dense[iVar2];
        dense[iVar2] = local_b4;
        mem_error = mem_error + 1;
        new_next = new_next + 1;
      }
    }
    ksupno = ksupno + 1;
    segsze = segsze + -1;
  } while( true );
}

Assistant:

int
ccopy_to_ucol(
	      int        jcol,	  /* in */
	      int        nseg,	  /* in */
	      int        *segrep,  /* in */
	      int        *repfnz,  /* in */
	      int        *perm_r,  /* in */
	      singlecomplex     *dense,   /* modified - reset to zero on return */
	      GlobalLU_t *Glu      /* modified */
	      )
{
/* 
 * Gather from SPA dense[*] to global ucol[*].
 */
    int ksub, krep, ksupno;
    int i, k, kfnz, segsze;
    int fsupc, irow, jsupno;
    int_t isub, nextu, new_next, mem_error;
    int       *xsup, *supno;
    int_t     *lsub, *xlsub;
    singlecomplex    *ucol;
    int_t     *usub, *xusub;
    int_t       nzumax;
    singlecomplex zero = {0.0, 0.0};

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    ucol    = (singlecomplex *) Glu->ucol;
    usub    = Glu->usub;
    xusub   = Glu->xusub;
    nzumax  = Glu->nzumax;
    
    jsupno = supno[jcol];
    nextu  = xusub[jcol];
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {
	krep = segrep[k--];
	ksupno = supno[krep];

	if ( ksupno != jsupno ) { /* Should go into ucol[] */
	    kfnz = repfnz[krep];
	    if ( kfnz != SLU_EMPTY ) {	/* Nonzero U-segment */

	    	fsupc = xsup[ksupno];
	        isub = xlsub[fsupc] + kfnz - fsupc;
	        segsze = krep - kfnz + 1;

		new_next = nextu + segsze;
		while ( new_next > nzumax ) {
		    mem_error = cLUMemXpand(jcol, nextu, UCOL, &nzumax, Glu);
		    if (mem_error) return (mem_error);
		    ucol = (singlecomplex *) Glu->ucol;
		    mem_error = cLUMemXpand(jcol, nextu, USUB, &nzumax, Glu);
		    if (mem_error) return (mem_error);
		    usub = Glu->usub;
		    lsub = Glu->lsub;
		}
		
		for (i = 0; i < segsze; i++) {
		    irow = lsub[isub];
		    usub[nextu] = perm_r[irow];
		    ucol[nextu] = dense[irow];
		    dense[irow] = zero;
		    nextu++;
		    isub++;
		} 

	    }

	}

    } /* for each segment... */

    xusub[jcol + 1] = nextu;      /* Close U[*,jcol] */
    return 0;
}